

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_transformation_compose_EXP
                    (matrix4 *self,vector3 *scale,quaternion *rotation,vector3 *translation)

{
  matrix4 rotateM;
  matrix4 local_120;
  anon_union_128_5_d0a4420b_for_matrix4_0 local_a0;
  
  (self->field_0).m[0] = 1.0;
  (self->field_0).m[1] = 0.0;
  (self->field_0).m[2] = 0.0;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[4] = 0.0;
  (self->field_0).m[5] = 1.0;
  (self->field_0).m[6] = 0.0;
  (self->field_0).m[7] = 0.0;
  (self->field_0).m[8] = 0.0;
  (self->field_0).m[9] = 0.0;
  (self->field_0).m[10] = 1.0;
  (self->field_0).m[0xb] = 0.0;
  (self->field_0).m[0xc] = 0.0;
  (self->field_0).m[0xd] = 0.0;
  (self->field_0).m[0xe] = 0.0;
  (self->field_0).m[0xf] = 1.0;
  local_a0.m[3] = 0.0;
  local_a0.m[4] = 0.0;
  local_a0.m[1] = 0.0;
  local_a0.m[2] = 0.0;
  local_a0.m[6] = 0.0;
  local_a0.m[7] = 0.0;
  local_a0.m[8] = 0.0;
  local_a0.m[9] = 0.0;
  local_a0.m[0xb] = 0.0;
  local_a0.m[0xc] = 0.0;
  local_a0.m[0xd] = 0.0;
  local_a0.m[0xe] = 0.0;
  local_a0.m[0xf] = 1.0;
  local_a0.m[0] = (scale->field_0).v[0];
  local_a0.m[5] = (scale->field_0).v[1];
  local_a0.m[10] = (scale->field_0).v[2];
  matrix4_multiply(self,(matrix4 *)&local_a0.field_1);
  matrix4_make_transformation_rotationq(&local_120,rotation);
  matrix4_multiply(self,&local_120);
  (self->field_0).m[3] = (translation->field_0).v[0];
  (self->field_0).m[7] = (translation->field_0).v[1];
  (self->field_0).m[0xb] = (translation->field_0).v[2];
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_transformation_compose_EXP(struct matrix4 *self, const struct vector3 *scale, const struct quaternion *rotation, const struct vector3 *translation)
{
	struct matrix4 scaleM, rotateM;

	matrix4_identity(self);

	/* scale */
	matrix4_multiply(self, matrix4_make_transformation_scalingv3(&scaleM, scale));

	/* rotate */
	matrix4_multiply(self, matrix4_make_transformation_rotationq(&rotateM, rotation));

	/* translate */
	self->c30 = translation->x;
	self->c31 = translation->y;
	self->c32 = translation->z;

	return self;
}